

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O3

int json_object_update(json_t *object,json_t *other)

{
  int iVar1;
  void *pvVar2;
  char *key;
  json_t *value;
  json_object_t *object_1;
  
  iVar1 = -1;
  if ((((object != (json_t *)0x0) && (other != (json_t *)0x0)) && (object->type == JSON_OBJECT)) &&
     (other->type == JSON_OBJECT)) {
    pvVar2 = hashtable_iter((hashtable_t *)(other + 1));
    if ((pvVar2 != (void *)0x0) && (key = (char *)hashtable_iter_key(pvVar2), key != (char *)0x0)) {
      while( true ) {
        value = (json_t *)hashtable_iter_value(key + -0x20);
        if (value == (json_t *)0x0) break;
        if (value->refcount != 0xffffffffffffffff) {
          value->refcount = value->refcount + 1;
        }
        iVar1 = json_object_set_new_nocheck(object,key,value);
        if (iVar1 != 0) {
          return -1;
        }
        if (((other->type != JSON_OBJECT) ||
            (pvVar2 = hashtable_iter_next((hashtable_t *)(other + 1),key + -0x20),
            pvVar2 == (void *)0x0)) ||
           (key = (char *)hashtable_iter_key(pvVar2), key == (char *)0x0)) break;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int json_object_update(json_t *object, json_t *other)
{
	const char *key;
	json_t *value;

	if (!json_is_object(object) || !json_is_object(other))
		return -1;

	json_object_foreach(other, key, value) {
		if (json_object_set_nocheck(object, key, value))
			return -1;
	}

	return 0;
}